

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_TEXLDL(Context *ctx)

{
  char *pcVar1;
  char *fmt;
  
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if (ctx->profile_supports_nv2 == 0) {
      pcVar1 = ctx->profile->name;
      fmt = "Pixel shader TEXLDL unsupported in %s profile";
LAB_0011ca00:
      failf(ctx,fmt,pcVar1);
      return;
    }
  }
  else if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (ctx->profile_supports_nv3 == 0)) {
    pcVar1 = ctx->profile->name;
    fmt = "Vertex shader TEXLDL unsupported in %s profile";
    goto LAB_0011ca00;
  }
  arb1_texld(ctx,"TXL",0);
  return;
}

Assistant:

static void emit_ARB1_TEXLDL(Context *ctx)
{
    if ((shader_is_vertex(ctx)) && (!support_nv3(ctx)))
    {
        failf(ctx, "Vertex shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    else if ((shader_is_pixel(ctx)) && (!support_nv2(ctx)))
    {
        failf(ctx, "Pixel shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    // !!! FIXME: this doesn't map exactly to TEXLDL. Review this.
    arb1_texld(ctx, "TXL", 0);
}